

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

ssize_t __thiscall kj::Executor::send(Executor *this,int __fd,void *__buf,size_t __n,int __flags)

{
  Mutex *pMVar1;
  Maybe<kj::_::XThreadEvent_&> *pMVar2;
  __pid_t _Var3;
  EventLoop *this_00;
  Executor *pEVar4;
  long *plVar5;
  undefined4 extraout_var;
  long *extraout_RAX;
  long *extraout_RAX_00;
  undefined4 in_register_00000034;
  XThreadEvent *this_01;
  long in_FS_OFFSET;
  bool bVar6;
  Locked<kj::Executor::Impl::State> lock;
  Fault f;
  DebugComparison<kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)_&,_kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)>
  _kjCondition;
  XThreadEvent *local_38;
  
  this_01 = (XThreadEvent *)CONCAT44(in_register_00000034,__fd);
  _kjCondition.left = &this_01->state;
  _kjCondition.result = this_01->state == UNUSED;
  _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (!_kjCondition.result) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::XThreadEvent::_unnamed_type_1_&,_unnamed_type_1_>&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x4fc,FAILED,"event.state == _::XThreadEvent::UNUSED","_kjCondition,",&_kjCondition)
    ;
    kj::_::Debug::Fault::fatal(&f);
  }
  if ((char)__buf == '\0') {
    this_00 = anon_unknown_173::currentEventLoop();
    pEVar4 = EventLoop::getExecutor(this_00);
    (this_01->replyExecutor).ptr = pEVar4;
  }
  else {
    if (*(long *)(in_FS_OFFSET + -0x28) == 0) {
      bVar6 = false;
    }
    else {
      bVar6 = *(Executor **)(*(long *)(in_FS_OFFSET + -0x28) + 0x48) == this;
    }
    if (bVar6) {
      (*(this_01->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember[5])(&f);
      _kjCondition.result = CONCAT71(f.exception._1_7_,f.exception._0_1_) == 0;
      _kjCondition._8_8_ = &kj::none;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.left = (anon_enum_32 *)&f;
      if (!_kjCondition.result) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>&,kj::None_const&>&,char_const(&)[84]>
                  ((Fault *)&lock,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                   ,0x509,FAILED,"promiseNode == kj::none",
                   "_kjCondition,\"can\'t call executeSync() on own thread\'s executor with a promise-returning function\""
                   ,(DebugComparison<kj::Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>_&,_const_kj::None_&>
                     *)&_kjCondition,
                   (char (*) [84])
                   "can\'t call executeSync() on own thread\'s executor with a promise-returning function"
                  );
        kj::_::Debug::Fault::fatal((Fault *)&lock);
      }
      if (bVar6) {
        return 0x517adf;
      }
    }
  }
  pMVar1 = (Mutex *)(this->impl).ptr;
  _kjCondition.left = (anon_enum_32 *)((ulong)_kjCondition.left & 0xffffffffffffff00);
  kj::_::Mutex::lock(pMVar1);
  lock.ptr = (State *)(pMVar1 + 1);
  plVar5 = *(long **)(pMVar1 + 1);
  lock.mutex = pMVar1;
  if (plVar5 == (long *)0x0) {
    kj::_::XThreadEvent::setDisconnected(this_01);
    plVar5 = extraout_RAX;
  }
  else {
    this_01->state = QUEUED;
    if ((this_01->targetLink).prev != (Maybe<kj::_::XThreadEvent_&> *)0x0) {
      kj::_::throwDoubleAdd();
    }
    pMVar2 = (Maybe<kj::_::XThreadEvent_&> *)pMVar1[1].waitersTail;
    pMVar2->ptr = this_01;
    (this_01->targetLink).prev = pMVar2;
    pMVar1[1].waitersTail = (Maybe<kj::_::Mutex::Waiter_&> *)&this_01->targetLink;
    *(long *)(pMVar1 + 2) = *(long *)(pMVar1 + 2) + 1;
    if ((long *)*plVar5 != (long *)0x0) {
      plVar5 = (long *)(**(code **)(*(long *)*plVar5 + 0x18))();
    }
    if ((char)__buf != '\0') {
      _kjCondition._8_8_ = &local_38;
      _kjCondition.left = (anon_enum_32 *)&PTR_check_00645480;
      _kjCondition.op.content.ptr = (char *)lock.ptr;
      f.exception._0_1_ = 0;
      local_38 = this_01;
      _Var3 = kj::_::Mutex::wait(lock.mutex,&_kjCondition);
      plVar5 = (long *)CONCAT44(extraout_var,_Var3);
    }
  }
  if (lock.mutex != (Mutex *)0x0) {
    kj::_::Mutex::unlock(lock.mutex,EXCLUSIVE,(Waiter *)0x0);
    plVar5 = extraout_RAX_00;
  }
  return (ssize_t)plVar5;
}

Assistant:

void Executor::send(_::XThreadEvent& event, bool sync) const {
  KJ_ASSERT(event.state == _::XThreadEvent::UNUSED);

  if (sync) {
    EventLoop* thisThread = threadLocalEventLoop;
    if (thisThread != nullptr &&
        thisThread->executor.map([this](auto& e) { return e == this; }).orDefault(false)) {
      // Invoking a sync request on our own thread. Just execute it directly; if we try to queue
      // it to the loop, we'll deadlock.
      auto promiseNode = event.execute();

      // If the function returns a promise, we have no way to pump the event loop to wait for it,
      // because the event loop may already be pumping somewhere up the stack.
      KJ_ASSERT(promiseNode == kj::none,
          "can't call executeSync() on own thread's executor with a promise-returning function");

      return;
    }
  } else {
    event.replyExecutor = getCurrentThreadExecutor();

    // Note that async requests will "just work" even if the target executor is our own thread's
    // executor. In theory we could detect this case to avoid some locking and signals but that
    // would be extra code complexity for probably little benefit.
  }

  auto lock = impl->state.lockExclusive();
  const EventLoop* loop;
  KJ_IF_SOME(l, lock->loop) {
    loop = &l;
  } else {
    event.setDisconnected();
    return;
  }